

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

void __thiscall phosg::Poll::add(Poll *this,int fd,short events)

{
  const_iterator cVar1;
  pollfd *ppVar2;
  const_iterator __position;
  undefined8 in_RAX;
  ulong uVar3;
  ulong uVar4;
  pollfd pfd;
  value_type local_8;
  
  local_8.revents = (short)((ulong)in_RAX >> 0x30);
  local_8.events = events;
  local_8.fd = fd;
  cVar1._M_current =
       (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
       super__Vector_impl_data._M_start;
  ppVar2 = (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)ppVar2 - (long)cVar1._M_current >> 3;
  while (__position._M_current = cVar1._M_current, 0 < (long)uVar4) {
    uVar3 = uVar4 >> 1;
    uVar4 = ~uVar3 + uVar4;
    cVar1._M_current = __position._M_current + uVar3 + 1;
    if (fd < __position._M_current[uVar3].fd) {
      cVar1._M_current = __position._M_current;
      uVar4 = uVar3;
    }
  }
  if ((__position._M_current == ppVar2) || ((__position._M_current)->fd != fd)) {
    std::vector<pollfd,_std::allocator<pollfd>_>::insert
              ((vector<pollfd,_std::allocator<pollfd>_> *)this,__position,&local_8);
  }
  else {
    (__position._M_current)->events = events;
  }
  return;
}

Assistant:

void Poll::add(int fd, short events) {
  auto pred = [](const struct pollfd& x, const struct pollfd& y) {
    return x.fd < y.fd;
  };

  struct pollfd pfd;
  pfd.fd = fd;
  pfd.events = events;
  auto insert_it = upper_bound(this->poll_fds.begin(), this->poll_fds.end(),
      pfd, pred);
  if (insert_it != this->poll_fds.end() && insert_it->fd == fd) {
    insert_it->events = events;
  } else {
    this->poll_fds.insert(insert_it, pfd);
  }
}